

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O2

void * __thiscall icu_63::UVector::orphanElementAt(UVector *this,int32_t index)

{
  void *pvVar1;
  int iVar2;
  ulong uVar3;
  
  if ((-1 < index) && (iVar2 = this->count, index < iVar2)) {
    uVar3 = (ulong)(uint)index;
    pvVar1 = this->elements[uVar3].pointer;
    for (; (int)uVar3 < iVar2 + -1; uVar3 = uVar3 + 1) {
      this->elements[uVar3] = this->elements[uVar3 + 1];
      iVar2 = this->count;
    }
    this->count = iVar2 + -1;
    return pvVar1;
  }
  return (void *)0x0;
}

Assistant:

void* UVector::orphanElementAt(int32_t index) {
    void* e = 0;
    if (0 <= index && index < count) {
        e = elements[index].pointer;
        for (int32_t i=index; i<count-1; ++i) {
            elements[i] = elements[i+1];
        }
        --count;
    }
    /* else index out of range */
    return e;
}